

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackBackTrace.h
# Opt level: O2

StackBackTrace *
StackBackTrace::Capture<Memory::NoThrowHeapAllocator>
          (NoThrowHeapAllocator *alloc,ULONG framesToSkip,ULONG framesToCapture)

{
  NoThrowHeapAllocator *alloc_00;
  StackBackTrace *this;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  data.typeinfo = (type_info *)((ulong)framesToCapture << 3);
  local_58 = (undefined1  [8])&typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_f5571;
  data.filename._0_4_ = 0x2f;
  alloc_00 = Memory::NoThrowHeapAllocator::TrackAllocInfo(alloc,(TrackAllocData *)local_58);
  this = (StackBackTrace *)new<Memory::NoThrowHeapAllocator>(8,alloc_00,0x227782,0);
  StackBackTrace(this,framesToSkip,framesToCapture);
  return this;
}

Assistant:

StackBackTrace *
StackBackTrace::Capture(TAllocator * alloc, ULONG framesToSkip, ULONG framesToCapture)
{
    return AllocatorNewPlusZ(TAllocator, alloc, sizeof(PVOID) * framesToCapture, StackBackTrace, framesToSkip, framesToCapture);
}